

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall flatbuffers::Parser::ParseArray(Parser *this,Value *array)

{
  ushort uVar1;
  anon_class_24_3_209e3f75 body;
  bool bVar2;
  size_t buffer_minalign;
  char *pcVar3;
  uint8_t *puVar4;
  Type *in_RDX;
  int local_214;
  offset_type local_210;
  int elem_18;
  Offset<void> local_208;
  offset_type local_204;
  Offset<void> elem_17;
  Offset<void> local_1fc;
  offset_type_conflict oStack_1f8;
  Offset<void> elem_16;
  Offset64<void> local_1e8;
  Offset64<void> elem_15;
  Offset<void> local_1d4;
  offset_type local_1d0;
  Offset<void> elem_14;
  Offset<void> local_1c8;
  byte local_1c1;
  Offset<void> elem_13;
  double elem_12;
  float local_1b0;
  byte local_1a9;
  float elem_11;
  uint64_t elem_10;
  long local_198;
  int64_t elem_9;
  uint local_188;
  byte local_181;
  uint32_t elem_8;
  byte local_179;
  int32_t elem_7;
  short local_174;
  byte local_172;
  uchar local_171;
  uint16_t elem_6;
  byte local_16e;
  uchar local_16d;
  int16_t elem_5;
  byte local_16a;
  uint8_t elem_4;
  int8_t elem_3;
  uint8_t elem_2;
  uint8_t elem_1;
  reference pVStack_168;
  uint8_t elem;
  Value *val;
  undefined1 local_158 [8];
  reverse_iterator it;
  string local_148 [32];
  uint local_128;
  byte local_121;
  StringOffsetMap **local_120;
  undefined1 *puStack_118;
  Value *local_110;
  undefined1 local_102 [8];
  CheckedError err;
  size_t count;
  undefined1 local_f0 [6];
  uint16_t length;
  undefined1 *local_d0;
  Type *type;
  undefined1 local_b8 [8];
  FlatBufferBuilder builder;
  vector<flatbuffers::Value,_std::allocator<flatbuffers::Value>_> stack;
  Value *array_local;
  Parser *this_local;
  CheckedError *ce;
  
  std::vector<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>::vector
            ((vector<flatbuffers::Value,_std::allocator<flatbuffers::Value>_> *)&builder.string_pool
            );
  buffer_minalign = AlignOf<unsigned_long>();
  FlatBufferBuilderImpl<false>::FlatBufferBuilderImpl
            ((FlatBufferBuilderImpl<false> *)local_b8,0x400,(Allocator *)0x0,false,buffer_minalign);
  Type::VectorType((Type *)local_f0,in_RDX);
  puStack_118 = local_f0;
  uVar1 = in_RDX->fixed_length;
  stack0xffffffffffffff00 = 0;
  local_120 = &builder.string_pool;
  body.type = (Type *)puStack_118;
  body.stack = (vector<flatbuffers::Value,_std::allocator<flatbuffers::Value>_> *)local_120;
  body.this = (Parser *)array;
  local_110 = array;
  local_d0 = puStack_118;
  ParseVectorDelimiters<flatbuffers::Parser::ParseArray(flatbuffers::Value&)::__0>
            ((Parser *)local_102,(size_t *)array,body);
  local_121 = 0;
  CheckedError::CheckedError((CheckedError *)this,(CheckedError *)local_102);
  bVar2 = CheckedError::Check((CheckedError *)this);
  if (bVar2) {
    local_121 = 1;
  }
  local_128 = (uint)bVar2;
  if ((local_121 & 1) == 0) {
    CheckedError::~CheckedError((CheckedError *)this);
  }
  if (local_128 == 0) {
    if (uVar1 == stack0xffffffffffffff00) {
      std::vector<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>::rbegin
                ((vector<flatbuffers::Value,_std::allocator<flatbuffers::Value>_> *)local_158);
      while( true ) {
        std::vector<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>::rend
                  ((vector<flatbuffers::Value,_std::allocator<flatbuffers::Value>_> *)&val);
        bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::Value_*,_std::vector<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>_>_>
                                 *)local_158,
                                (reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::Value_*,_std::vector<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>_>_>
                                 *)&val);
        if (!bVar2) break;
        pVStack_168 = std::
                      reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::Value_*,_std::vector<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>_>_>
                      ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::Value_*,_std::vector<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>_>_>
                                   *)local_158);
        switch((pVStack_168->type).base_type) {
        case BASE_TYPE_NONE:
          bVar2 = IsStruct(&pVStack_168->type);
          if (bVar2) {
            SerializeStruct((Parser *)array,(FlatBufferBuilder *)local_b8,
                            (pVStack_168->type).struct_def,pVStack_168);
          }
          else {
            local_16a = 0;
            pcVar3 = (char *)std::__cxx11::string::c_str();
            anon_unknown_0::atot<unsigned_char>
                      ((anon_unknown_0 *)this,pcVar3,(Parser *)array,&elem_4);
            bVar2 = CheckedError::Check((CheckedError *)this);
            if (bVar2) {
              local_16a = 1;
            }
            local_128 = (uint)bVar2;
            if ((local_16a & 1) == 0) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
            if (local_128 != 0) goto LAB_0011ba88;
            FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                      ((FlatBufferBuilderImpl<false> *)local_b8,elem_4);
          }
          break;
        case BASE_TYPE_UTYPE:
          bVar2 = IsStruct(&pVStack_168->type);
          if (bVar2) {
            SerializeStruct((Parser *)array,(FlatBufferBuilder *)local_b8,
                            (pVStack_168->type).struct_def,pVStack_168);
          }
          else {
            elem_5._0_1_ = 0;
            pcVar3 = (char *)std::__cxx11::string::c_str();
            anon_unknown_0::atot<unsigned_char>
                      ((anon_unknown_0 *)this,pcVar3,(Parser *)array,(uchar *)((long)&elem_5 + 1));
            bVar2 = CheckedError::Check((CheckedError *)this);
            if (bVar2) {
              elem_5._0_1_ = 1;
            }
            local_128 = (uint)bVar2;
            if (((byte)elem_5 & 1) == 0) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
            if (local_128 != 0) goto LAB_0011ba88;
            FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                      ((FlatBufferBuilderImpl<false> *)local_b8,elem_5._1_1_);
          }
          break;
        case BASE_TYPE_BOOL:
          bVar2 = IsStruct(&pVStack_168->type);
          if (bVar2) {
            SerializeStruct((Parser *)array,(FlatBufferBuilder *)local_b8,
                            (pVStack_168->type).struct_def,pVStack_168);
          }
          else {
            local_16e = 0;
            pcVar3 = (char *)std::__cxx11::string::c_str();
            anon_unknown_0::atot<unsigned_char>
                      ((anon_unknown_0 *)this,pcVar3,(Parser *)array,&local_16d);
            bVar2 = CheckedError::Check((CheckedError *)this);
            if (bVar2) {
              local_16e = 1;
            }
            local_128 = (uint)bVar2;
            if ((local_16e & 1) == 0) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
            if (local_128 != 0) goto LAB_0011ba88;
            FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                      ((FlatBufferBuilderImpl<false> *)local_b8,local_16d);
          }
          break;
        case BASE_TYPE_CHAR:
          bVar2 = IsStruct(&pVStack_168->type);
          if (bVar2) {
            SerializeStruct((Parser *)array,(FlatBufferBuilder *)local_b8,
                            (pVStack_168->type).struct_def,pVStack_168);
          }
          else {
            elem_6._0_1_ = 0;
            pcVar3 = (char *)std::__cxx11::string::c_str();
            anon_unknown_0::atot<signed_char>
                      ((anon_unknown_0 *)this,pcVar3,(Parser *)array,(char *)((long)&elem_6 + 1));
            bVar2 = CheckedError::Check((CheckedError *)this);
            if (bVar2) {
              elem_6._0_1_ = 1;
            }
            local_128 = (uint)bVar2;
            if (((byte)elem_6 & 1) == 0) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
            if (local_128 != 0) goto LAB_0011ba88;
            FlatBufferBuilderImpl<false>::PushElement<signed_char,unsigned_int>
                      ((FlatBufferBuilderImpl<false> *)local_b8,elem_6._1_1_);
          }
          break;
        case BASE_TYPE_UCHAR:
          bVar2 = IsStruct(&pVStack_168->type);
          if (bVar2) {
            SerializeStruct((Parser *)array,(FlatBufferBuilder *)local_b8,
                            (pVStack_168->type).struct_def,pVStack_168);
          }
          else {
            local_172 = 0;
            pcVar3 = (char *)std::__cxx11::string::c_str();
            anon_unknown_0::atot<unsigned_char>
                      ((anon_unknown_0 *)this,pcVar3,(Parser *)array,&local_171);
            bVar2 = CheckedError::Check((CheckedError *)this);
            if (bVar2) {
              local_172 = 1;
            }
            local_128 = (uint)bVar2;
            if ((local_172 & 1) == 0) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
            if (local_128 != 0) goto LAB_0011ba88;
            FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                      ((FlatBufferBuilderImpl<false> *)local_b8,local_171);
          }
          break;
        case BASE_TYPE_SHORT:
          bVar2 = IsStruct(&pVStack_168->type);
          if (bVar2) {
            SerializeStruct((Parser *)array,(FlatBufferBuilder *)local_b8,
                            (pVStack_168->type).struct_def,pVStack_168);
          }
          else {
            elem_7._3_1_ = 0;
            pcVar3 = (char *)std::__cxx11::string::c_str();
            anon_unknown_0::atot<short>((anon_unknown_0 *)this,pcVar3,(Parser *)array,&local_174);
            bVar2 = CheckedError::Check((CheckedError *)this);
            if (bVar2) {
              elem_7._3_1_ = 1;
            }
            local_128 = (uint)bVar2;
            if ((elem_7._3_1_ & 1) == 0) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
            if (local_128 != 0) goto LAB_0011ba88;
            FlatBufferBuilderImpl<false>::PushElement<short,unsigned_int>
                      ((FlatBufferBuilderImpl<false> *)local_b8,local_174);
          }
          break;
        case BASE_TYPE_USHORT:
          bVar2 = IsStruct(&pVStack_168->type);
          if (bVar2) {
            SerializeStruct((Parser *)array,(FlatBufferBuilder *)local_b8,
                            (pVStack_168->type).struct_def,pVStack_168);
          }
          else {
            local_179 = 0;
            pcVar3 = (char *)std::__cxx11::string::c_str();
            anon_unknown_0::atot<unsigned_short>
                      ((anon_unknown_0 *)this,pcVar3,(Parser *)array,(unsigned_short *)&elem_7);
            bVar2 = CheckedError::Check((CheckedError *)this);
            if (bVar2) {
              local_179 = 1;
            }
            local_128 = (uint)bVar2;
            if ((local_179 & 1) == 0) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
            if (local_128 != 0) goto LAB_0011ba88;
            FlatBufferBuilderImpl<false>::PushElement<unsigned_short,unsigned_int>
                      ((FlatBufferBuilderImpl<false> *)local_b8,(unsigned_short)elem_7);
          }
          break;
        case BASE_TYPE_INT:
          bVar2 = IsStruct(&pVStack_168->type);
          if (bVar2) {
            SerializeStruct((Parser *)array,(FlatBufferBuilder *)local_b8,
                            (pVStack_168->type).struct_def,pVStack_168);
          }
          else {
            local_181 = 0;
            pcVar3 = (char *)std::__cxx11::string::c_str();
            anon_unknown_0::atot<int>((anon_unknown_0 *)this,pcVar3,(Parser *)array,(int *)&elem_8);
            bVar2 = CheckedError::Check((CheckedError *)this);
            if (bVar2) {
              local_181 = 1;
            }
            local_128 = (uint)bVar2;
            if ((local_181 & 1) == 0) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
            if (local_128 != 0) goto LAB_0011ba88;
            FlatBufferBuilderImpl<false>::PushElement<int,unsigned_int>
                      ((FlatBufferBuilderImpl<false> *)local_b8,elem_8);
          }
          break;
        case BASE_TYPE_UINT:
          bVar2 = IsStruct(&pVStack_168->type);
          if (bVar2) {
            SerializeStruct((Parser *)array,(FlatBufferBuilder *)local_b8,
                            (pVStack_168->type).struct_def,pVStack_168);
          }
          else {
            elem_9._7_1_ = 0;
            pcVar3 = (char *)std::__cxx11::string::c_str();
            anon_unknown_0::atot<unsigned_int>
                      ((anon_unknown_0 *)this,pcVar3,(Parser *)array,&local_188);
            bVar2 = CheckedError::Check((CheckedError *)this);
            if (bVar2) {
              elem_9._7_1_ = 1;
            }
            local_128 = (uint)bVar2;
            if ((elem_9._7_1_ & 1) == 0) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
            if (local_128 != 0) goto LAB_0011ba88;
            FlatBufferBuilderImpl<false>::PushElement<unsigned_int,unsigned_int>
                      ((FlatBufferBuilderImpl<false> *)local_b8,local_188);
          }
          break;
        case BASE_TYPE_LONG:
          bVar2 = IsStruct(&pVStack_168->type);
          if (bVar2) {
            SerializeStruct((Parser *)array,(FlatBufferBuilder *)local_b8,
                            (pVStack_168->type).struct_def,pVStack_168);
          }
          else {
            elem_10._7_1_ = 0;
            pcVar3 = (char *)std::__cxx11::string::c_str();
            anon_unknown_0::atot<long>((anon_unknown_0 *)this,pcVar3,(Parser *)array,&local_198);
            bVar2 = CheckedError::Check((CheckedError *)this);
            if (bVar2) {
              elem_10._7_1_ = 1;
            }
            local_128 = (uint)bVar2;
            if ((elem_10._7_1_ & 1) == 0) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
            if (local_128 != 0) goto LAB_0011ba88;
            FlatBufferBuilderImpl<false>::PushElement<long,unsigned_int>
                      ((FlatBufferBuilderImpl<false> *)local_b8,local_198);
          }
          break;
        case BASE_TYPE_ULONG:
          bVar2 = IsStruct(&pVStack_168->type);
          if (bVar2) {
            SerializeStruct((Parser *)array,(FlatBufferBuilder *)local_b8,
                            (pVStack_168->type).struct_def,pVStack_168);
          }
          else {
            local_1a9 = 0;
            pcVar3 = (char *)std::__cxx11::string::c_str();
            anon_unknown_0::atot<unsigned_long>
                      ((anon_unknown_0 *)this,pcVar3,(Parser *)array,(unsigned_long *)&elem_11);
            bVar2 = CheckedError::Check((CheckedError *)this);
            if (bVar2) {
              local_1a9 = 1;
            }
            local_128 = (uint)bVar2;
            if ((local_1a9 & 1) == 0) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
            if (local_128 != 0) goto LAB_0011ba88;
            FlatBufferBuilderImpl<false>::PushElement<unsigned_long,unsigned_int>
                      ((FlatBufferBuilderImpl<false> *)local_b8,_elem_11);
          }
          break;
        case BASE_TYPE_FLOAT:
          bVar2 = IsStruct(&pVStack_168->type);
          if (bVar2) {
            SerializeStruct((Parser *)array,(FlatBufferBuilder *)local_b8,
                            (pVStack_168->type).struct_def,pVStack_168);
          }
          else {
            pcVar3 = (char *)std::__cxx11::string::c_str();
            anon_unknown_0::atot<float>((anon_unknown_0 *)this,pcVar3,(Parser *)array,&local_1b0);
            bVar2 = CheckedError::Check((CheckedError *)this);
            local_128 = (uint)bVar2;
            if (!bVar2) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
            if (local_128 != 0) goto LAB_0011ba88;
            FlatBufferBuilderImpl<false>::PushElement<float,unsigned_int>
                      ((FlatBufferBuilderImpl<false> *)local_b8,local_1b0);
          }
          break;
        case BASE_TYPE_DOUBLE:
          bVar2 = IsStruct(&pVStack_168->type);
          if (bVar2) {
            SerializeStruct((Parser *)array,(FlatBufferBuilder *)local_b8,
                            (pVStack_168->type).struct_def,pVStack_168);
          }
          else {
            local_1c1 = 0;
            pcVar3 = (char *)std::__cxx11::string::c_str();
            anon_unknown_0::atot<double>
                      ((anon_unknown_0 *)this,pcVar3,(Parser *)array,(double *)&elem_13);
            bVar2 = CheckedError::Check((CheckedError *)this);
            if (bVar2) {
              local_1c1 = 1;
            }
            local_128 = (uint)bVar2;
            if ((local_1c1 & 1) == 0) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
            if (local_128 != 0) goto LAB_0011ba88;
            FlatBufferBuilderImpl<false>::PushElement<double,unsigned_int>
                      ((FlatBufferBuilderImpl<false> *)local_b8,_elem_13);
          }
          break;
        case BASE_TYPE_STRING:
          bVar2 = IsStruct(&pVStack_168->type);
          if (bVar2) {
            SerializeStruct((Parser *)array,(FlatBufferBuilder *)local_b8,
                            (pVStack_168->type).struct_def,pVStack_168);
          }
          else {
            Offset<void>::Offset(&local_1c8);
            elem_14.o._3_1_ = 0;
            pcVar3 = (char *)std::__cxx11::string::c_str();
            (anonymous_namespace)::atot<flatbuffers::Offset<void>>
                      ((_anonymous_namespace_ *)this,pcVar3,(Parser *)array,&local_1c8);
            bVar2 = CheckedError::Check((CheckedError *)this);
            if (bVar2) {
              elem_14.o._3_1_ = 1;
            }
            local_128 = (uint)bVar2;
            if ((elem_14.o._3_1_ & 1) == 0) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
            if (local_128 != 0) goto LAB_0011ba88;
            local_1d0 = local_1c8.o;
            FlatBufferBuilderImpl<false>::PushElement<void,flatbuffers::Offset>
                      ((FlatBufferBuilderImpl<false> *)local_b8,local_1c8);
          }
          break;
        case BASE_TYPE_VECTOR:
          bVar2 = IsStruct(&pVStack_168->type);
          if (bVar2) {
            SerializeStruct((Parser *)array,(FlatBufferBuilder *)local_b8,
                            (pVStack_168->type).struct_def,pVStack_168);
          }
          else {
            Offset<void>::Offset(&local_1d4);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            (anonymous_namespace)::atot<flatbuffers::Offset<void>>
                      ((_anonymous_namespace_ *)this,pcVar3,(Parser *)array,&local_1d4);
            bVar2 = CheckedError::Check((CheckedError *)this);
            local_128 = (uint)bVar2;
            if (!bVar2) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
            if (local_128 != 0) goto LAB_0011ba88;
            elem_15.o._4_4_ = local_1d4.o;
            FlatBufferBuilderImpl<false>::PushElement<void,flatbuffers::Offset>
                      ((FlatBufferBuilderImpl<false> *)local_b8,local_1d4);
          }
          break;
        case BASE_TYPE_STRUCT:
          bVar2 = IsStruct(&pVStack_168->type);
          if (bVar2) {
            SerializeStruct((Parser *)array,(FlatBufferBuilder *)local_b8,
                            (pVStack_168->type).struct_def,pVStack_168);
          }
          else {
            Offset<void>::Offset(&local_1fc);
            elem_17.o._3_1_ = 0;
            pcVar3 = (char *)std::__cxx11::string::c_str();
            (anonymous_namespace)::atot<flatbuffers::Offset<void>>
                      ((_anonymous_namespace_ *)this,pcVar3,(Parser *)array,&local_1fc);
            bVar2 = CheckedError::Check((CheckedError *)this);
            if (bVar2) {
              elem_17.o._3_1_ = 1;
            }
            local_128 = (uint)bVar2;
            if ((elem_17.o._3_1_ & 1) == 0) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
            if (local_128 != 0) goto LAB_0011ba88;
            local_204 = local_1fc.o;
            FlatBufferBuilderImpl<false>::PushElement<void,flatbuffers::Offset>
                      ((FlatBufferBuilderImpl<false> *)local_b8,local_1fc);
          }
          break;
        case BASE_TYPE_UNION:
          bVar2 = IsStruct(&pVStack_168->type);
          if (bVar2) {
            SerializeStruct((Parser *)array,(FlatBufferBuilder *)local_b8,
                            (pVStack_168->type).struct_def,pVStack_168);
          }
          else {
            Offset<void>::Offset(&local_208);
            elem_18._3_1_ = 0;
            pcVar3 = (char *)std::__cxx11::string::c_str();
            (anonymous_namespace)::atot<flatbuffers::Offset<void>>
                      ((_anonymous_namespace_ *)this,pcVar3,(Parser *)array,&local_208);
            bVar2 = CheckedError::Check((CheckedError *)this);
            if (bVar2) {
              elem_18._3_1_ = 1;
            }
            local_128 = (uint)bVar2;
            if ((elem_18._3_1_ & 1) == 0) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
            if (local_128 != 0) goto LAB_0011ba88;
            local_210 = local_208.o;
            FlatBufferBuilderImpl<false>::PushElement<void,flatbuffers::Offset>
                      ((FlatBufferBuilderImpl<false> *)local_b8,local_208);
          }
          break;
        case BASE_TYPE_ARRAY:
          bVar2 = IsStruct(&pVStack_168->type);
          if (bVar2) {
            SerializeStruct((Parser *)array,(FlatBufferBuilder *)local_b8,
                            (pVStack_168->type).struct_def,pVStack_168);
          }
          else {
            pcVar3 = (char *)std::__cxx11::string::c_str();
            anon_unknown_0::atot<int>((anon_unknown_0 *)this,pcVar3,(Parser *)array,&local_214);
            bVar2 = CheckedError::Check((CheckedError *)this);
            local_128 = (uint)bVar2;
            if (!bVar2) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
            if (local_128 != 0) goto LAB_0011ba88;
            FlatBufferBuilderImpl<false>::PushElement<int,unsigned_int>
                      ((FlatBufferBuilderImpl<false> *)local_b8,local_214);
          }
          break;
        case BASE_TYPE_VECTOR64:
          bVar2 = IsStruct(&pVStack_168->type);
          if (bVar2) {
            SerializeStruct((Parser *)array,(FlatBufferBuilder *)local_b8,
                            (pVStack_168->type).struct_def,pVStack_168);
          }
          else {
            Offset64<void>::Offset64(&local_1e8);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            (anonymous_namespace)::atot<flatbuffers::Offset64<void>>
                      ((_anonymous_namespace_ *)this,pcVar3,(Parser *)array,&local_1e8);
            bVar2 = CheckedError::Check((CheckedError *)this);
            local_128 = (uint)bVar2;
            if (!bVar2) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
            if (local_128 != 0) goto LAB_0011ba88;
            oStack_1f8 = local_1e8.o;
            FlatBufferBuilderImpl<false>::PushElement<void,flatbuffers::Offset64>
                      ((FlatBufferBuilderImpl<false> *)local_b8,local_1e8);
          }
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                        ,0x741,"CheckedError flatbuffers::Parser::ParseArray(Value &)");
        }
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::Value_*,_std::vector<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>_>_>
        ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::Value_*,_std::vector<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>_>_>
                      *)local_158);
      }
      puVar4 = FlatBufferBuilderImpl<false>::GetCurrentBufferPointer
                         ((FlatBufferBuilderImpl<false> *)local_b8);
      InlineSize(in_RDX);
      std::__cxx11::string::assign((char *)(in_RDX + 1),(ulong)puVar4);
      anon_unknown_0::NoError();
      local_128 = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_148,"Fixed-length array size is incorrect.",
                 (allocator<char> *)((long)&it.current._M_current + 7));
      Error(this,(string *)array);
      std::__cxx11::string::~string(local_148);
      std::allocator<char>::~allocator((allocator<char> *)((long)&it.current._M_current + 7));
      local_128 = 1;
    }
  }
LAB_0011ba88:
  CheckedError::~CheckedError((CheckedError *)local_102);
  FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl((FlatBufferBuilderImpl<false> *)local_b8);
  std::vector<flatbuffers::Value,_std::allocator<flatbuffers::Value>_>::~vector
            ((vector<flatbuffers::Value,_std::allocator<flatbuffers::Value>_> *)&builder.string_pool
            );
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseArray(Value &array) {
  std::vector<Value> stack;
  FlatBufferBuilder builder;
  const auto &type = array.type.VectorType();
  auto length = array.type.fixed_length;
  size_t count = 0;
  auto err = ParseVectorDelimiters(count, [&](size_t &) -> CheckedError {
    stack.emplace_back(Value());
    auto &val = stack.back();
    val.type = type;
    if (IsStruct(type)) {
      ECHECK(ParseTable(*val.type.struct_def, &val.constant, nullptr));
    } else {
      ECHECK(ParseSingleValue(nullptr, val, false));
    }
    return NoError();
  });
  ECHECK(err);
  if (length != count) return Error("Fixed-length array size is incorrect.");

  for (auto it = stack.rbegin(); it != stack.rend(); ++it) {
    auto &val = *it;
    // clang-format off
    switch (val.type.base_type) {
      #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, ...) \
        case BASE_TYPE_ ## ENUM: \
          if (IsStruct(val.type)) { \
            SerializeStruct(builder, *val.type.struct_def, val); \
          } else { \
            CTYPE elem; \
            ECHECK(atot(val.constant.c_str(), *this, &elem)); \
            builder.PushElement(elem); \
          } \
        break;
        FLATBUFFERS_GEN_TYPES(FLATBUFFERS_TD)
      #undef FLATBUFFERS_TD
      default: FLATBUFFERS_ASSERT(0);
    }
    // clang-format on
  }

  array.constant.assign(
      reinterpret_cast<const char *>(builder.GetCurrentBufferPointer()),
      InlineSize(array.type));
  return NoError();
}